

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O2

bool __thiscall
flatbuffers::rust::RustGenerator::TableBuilderArgsNeedsLifetime
          (RustGenerator *this,StructDef *struct_def)

{
  pointer ppFVar1;
  bool bVar2;
  pointer ppFVar3;
  
  if (struct_def->fixed == true) {
    __assert_fail("!struct_def.fixed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp"
                  ,0x212,
                  "bool flatbuffers::rust::RustGenerator::TableBuilderArgsNeedsLifetime(const StructDef &) const"
                 );
  }
  for (ppFVar3 = (struct_def->fields).vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppFVar1 = (struct_def->fields).vec.
                super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                ._M_impl.super__Vector_impl_data._M_finish, ppFVar3 != ppFVar1;
      ppFVar3 = ppFVar3 + 1) {
    if ((*ppFVar3)->deprecated == false) {
      bVar2 = TableBuilderTypeNeedsLifetime(this,&((*ppFVar3)->value).type);
      if (bVar2) break;
    }
  }
  return ppFVar3 != ppFVar1;
}

Assistant:

bool TableBuilderArgsNeedsLifetime(const StructDef &struct_def) const {
    FLATBUFFERS_ASSERT(!struct_def.fixed);

    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const auto &field = **it;
      if (field.deprecated) { continue; }

      if (TableBuilderTypeNeedsLifetime(field.value.type)) { return true; }
    }

    return false;
  }